

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

void __thiscall
notch::core::AdaDelta::adaDeltaRule
          (AdaDelta *this,Array *var,Array *grad,float *squaredVarDelta,float *squaredGradAccum)

{
  float *pfVar1;
  float *pfVar2;
  float *y_begin;
  float *y_end;
  float fVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  float eta;
  float delta_RMS;
  float grad_RMS;
  float grad2;
  float *g_end;
  float *g_begin;
  float *squaredGradAccum_local;
  float *squaredVarDelta_local;
  Array *grad_local;
  Array *var_local;
  AdaDelta *this_local;
  
  pfVar1 = std::begin<float>(grad);
  pfVar2 = std::end<float>(grad);
  fVar3 = internal::dot<float_const*,float_const*>(pfVar1,pfVar2,pfVar1,pfVar2);
  *squaredGradAccum = this->momentum * *squaredGradAccum + (1.0 - this->momentum) * fVar3;
  dVar5 = sqrt((double)(*squaredGradAccum + this->epsilon));
  dVar6 = sqrt((double)(*squaredVarDelta + this->epsilon));
  fVar4 = (float)dVar6 / (float)dVar5;
  *squaredVarDelta =
       this->momentum * *squaredVarDelta + (1.0 - this->momentum) * fVar3 * fVar4 * fVar4;
  pfVar1 = std::begin<float>(grad);
  pfVar2 = std::end<float>(grad);
  y_begin = std::begin<float>(var);
  y_end = std::end<float>(var);
  internal::scaleAdd<float_const*,float*>(-fVar4,pfVar1,pfVar2,y_begin,y_end);
  return;
}

Assistant:

void adaDeltaRule(Array &var, const Array &grad,
                     float &squaredVarDelta, float &squaredGradAccum) {
        auto g_begin = std::begin(grad);
        auto g_end = std::end(grad);
        // compute gradient norm
        float grad2 = internal::dot(g_begin, g_end, g_begin, g_end);
        // accumuate squared gradient (with exponential smoothing)
        squaredGradAccum = momentum*squaredGradAccum + (1-momentum)*grad2;
        // compute updates (time step)
        float grad_RMS = sqrt(squaredGradAccum + epsilon);
        float delta_RMS = sqrt(squaredVarDelta + epsilon);
        float eta = delta_RMS / grad_RMS;
        // accumuate squared updates (with exponential smoothing)
        squaredVarDelta = momentum*squaredVarDelta + (1-momentum)*grad2*eta*eta;
        // apply updates: var = var - eta * grad
        internal::scaleAdd(-eta,                      // - eta
                std::begin(grad), std::end(grad),     // * grad
                std::begin(var), std::end(var));      // + var =: var
    }